

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakDetectorTest_memoryCorruption_Test::
~TEST_MemoryLeakDetectorTest_memoryCorruption_Test
          (TEST_MemoryLeakDetectorTest_memoryCorruption_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, memoryCorruption)
{
    char* mem = detector->allocMemory(defaultMallocAllocator(), 10, "ALLOC.c", 10);
    mem[10] = 'O';
    mem[11] = 'H';
    detector->deallocMemory(defaultMallocAllocator(), mem, "FREE.c", 100);
    detector->stopChecking();
    CHECK(reporter->message->contains("Memory corruption"));
    CHECK(reporter->message->contains("   allocated at file: ALLOC.c line: 10 size: 10 type: malloc"));
    CHECK(reporter->message->contains("   deallocated at file: FREE.c line: 100 type: free"));
}